

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolverTypes.h
# Opt level: O0

void __thiscall
Minisat::
OccLists<int,_Minisat::vec<unsigned_int,_int>,_Minisat::SimpSolver::ClauseDeleted,_Minisat::MkIndexDefault<int>_>
::clean(OccLists<int,_Minisat::vec<unsigned_int,_int>,_Minisat::SimpSolver::ClauseDeleted,_Minisat::MkIndexDefault<int>_>
        *this,int *idx)

{
  uint uVar1;
  bool bVar2;
  Size SVar3;
  vec<unsigned_int,_int> *this_00;
  uint *puVar4;
  char *pcVar5;
  int local_28;
  int local_24;
  int j;
  int i;
  vec<unsigned_int,_int> *vec;
  int *idx_local;
  OccLists<int,_Minisat::vec<unsigned_int,_int>,_Minisat::SimpSolver::ClauseDeleted,_Minisat::MkIndexDefault<int>_>
  *this_local;
  
  this_00 = IntMap<int,_Minisat::vec<unsigned_int,_int>,_Minisat::MkIndexDefault<int>_>::operator[]
                      (&this->occs,*idx);
  local_28 = 0;
  local_24 = 0;
  while( true ) {
    SVar3 = vec<unsigned_int,_int>::size(this_00);
    if (SVar3 <= local_24) break;
    puVar4 = vec<unsigned_int,_int>::operator[](this_00,local_24);
    bVar2 = SimpSolver::ClauseDeleted::operator()(&this->deleted,puVar4);
    if (!bVar2) {
      puVar4 = vec<unsigned_int,_int>::operator[](this_00,local_24);
      uVar1 = *puVar4;
      puVar4 = vec<unsigned_int,_int>::operator[](this_00,local_28);
      *puVar4 = uVar1;
      local_28 = local_28 + 1;
    }
    local_24 = local_24 + 1;
  }
  vec<unsigned_int,_int>::shrink(this_00,local_24 - local_28);
  pcVar5 = IntMap<int,_char,_Minisat::MkIndexDefault<int>_>::operator[](&this->dirty,*idx);
  *pcVar5 = '\0';
  return;
}

Assistant:

void OccLists<K,Vec,Deleted,MkIndex>::clean(const K& idx)
{
    Vec& vec = occs[idx];
    int  i, j;
    for (i = j = 0; i < vec.size(); i++)
        if (!deleted(vec[i]))
            vec[j++] = vec[i];
    vec.shrink(i - j);
    dirty[idx] = 0;
}